

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwWindowHint(int target,int hint)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  GLboolean GVar12;
  GLboolean GVar13;
  GLboolean GVar14;
  GLboolean GVar15;
  int iVar16;
  GLboolean GVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  GLboolean GVar22;
  GLboolean GVar23;
  int iVar24;
  int iVar25;
  GLboolean GVar26;
  int hint_local;
  int target_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    iVar1 = _glfw.hints.redBits;
    iVar2 = _glfw.hints.greenBits;
    iVar3 = _glfw.hints.blueBits;
    iVar4 = _glfw.hints.alphaBits;
    iVar5 = _glfw.hints.depthBits;
    iVar6 = _glfw.hints.stencilBits;
    iVar7 = _glfw.hints.accumRedBits;
    iVar8 = _glfw.hints.accumGreenBits;
    iVar9 = _glfw.hints.accumBlueBits;
    iVar10 = _glfw.hints.accumAlphaBits;
    iVar11 = _glfw.hints.auxBuffers;
    GVar12 = _glfw.hints.stereo;
    GVar13 = _glfw.hints.resizable;
    GVar14 = _glfw.hints.visible;
    GVar15 = _glfw.hints.decorated;
    iVar16 = _glfw.hints.samples;
    GVar17 = _glfw.hints.sRGB;
    iVar18 = _glfw.hints.refreshRate;
    iVar19 = _glfw.hints.clientAPI;
    iVar20 = _glfw.hints.glMajor;
    iVar21 = _glfw.hints.glMinor;
    GVar22 = _glfw.hints.glForward;
    GVar23 = _glfw.hints.glDebug;
    iVar24 = _glfw.hints.glProfile;
    iVar25 = _glfw.hints.glRobustness;
  }
  else {
    GVar26 = (GLboolean)hint;
    iVar1 = _glfw.hints.redBits;
    iVar2 = _glfw.hints.greenBits;
    iVar3 = _glfw.hints.blueBits;
    iVar4 = _glfw.hints.alphaBits;
    iVar5 = _glfw.hints.depthBits;
    iVar6 = _glfw.hints.stencilBits;
    iVar7 = _glfw.hints.accumRedBits;
    iVar8 = _glfw.hints.accumGreenBits;
    iVar9 = _glfw.hints.accumBlueBits;
    iVar10 = _glfw.hints.accumAlphaBits;
    iVar11 = _glfw.hints.auxBuffers;
    GVar12 = _glfw.hints.stereo;
    GVar13 = GVar26;
    GVar14 = _glfw.hints.visible;
    GVar15 = _glfw.hints.decorated;
    iVar16 = _glfw.hints.samples;
    GVar17 = _glfw.hints.sRGB;
    iVar18 = _glfw.hints.refreshRate;
    iVar19 = _glfw.hints.clientAPI;
    iVar20 = _glfw.hints.glMajor;
    iVar21 = _glfw.hints.glMinor;
    GVar22 = _glfw.hints.glForward;
    GVar23 = _glfw.hints.glDebug;
    iVar24 = _glfw.hints.glProfile;
    iVar25 = _glfw.hints.glRobustness;
    if ((((((((target != 0x20003) &&
             (GVar13 = _glfw.hints.resizable, GVar14 = GVar26, target != 0x20004)) &&
            (GVar14 = _glfw.hints.visible, GVar15 = GVar26, target != 0x20005)) &&
           (((iVar1 = hint, GVar15 = _glfw.hints.decorated, target != 0x21001 &&
             (iVar1 = _glfw.hints.redBits, iVar2 = hint, target != 0x21002)) &&
            ((iVar2 = _glfw.hints.greenBits, iVar3 = hint, target != 0x21003 &&
             ((iVar3 = _glfw.hints.blueBits, iVar4 = hint, target != 0x21004 &&
              (iVar4 = _glfw.hints.alphaBits, iVar5 = hint, target != 0x21005)))))))) &&
          (iVar5 = _glfw.hints.depthBits, iVar6 = hint, target != 0x21006)) &&
         (((((iVar6 = _glfw.hints.stencilBits, iVar7 = hint, target != 0x21007 &&
             (iVar7 = _glfw.hints.accumRedBits, iVar8 = hint, target != 0x21008)) &&
            (iVar8 = _glfw.hints.accumGreenBits, iVar9 = hint, target != 0x21009)) &&
           ((iVar9 = _glfw.hints.accumBlueBits, iVar10 = hint, target != 0x2100a &&
            (iVar10 = _glfw.hints.accumAlphaBits, iVar11 = hint, target != 0x2100b)))) &&
          ((iVar11 = _glfw.hints.auxBuffers, GVar12 = GVar26, target != 0x2100c &&
           ((GVar12 = _glfw.hints.stereo, iVar16 = hint, target != 0x2100d &&
            (iVar16 = _glfw.hints.samples, GVar17 = GVar26, target != 0x2100e)))))))) &&
        ((GVar17 = _glfw.hints.sRGB, iVar18 = hint, target != 0x2100f &&
         (((iVar18 = _glfw.hints.refreshRate, iVar19 = hint, target != 0x22001 &&
           (iVar19 = _glfw.hints.clientAPI, iVar20 = hint, target != 0x22002)) &&
          (iVar20 = _glfw.hints.glMajor, iVar21 = hint, target != 0x22003)))))) &&
       (((iVar21 = _glfw.hints.glMinor, iVar25 = hint, target != 0x22005 &&
         (GVar22 = GVar26, iVar25 = _glfw.hints.glRobustness, target != 0x22006)) &&
        ((GVar22 = _glfw.hints.glForward, GVar23 = GVar26, target != 0x22007 &&
         (GVar23 = _glfw.hints.glDebug, iVar24 = hint, target != 0x22008)))))) {
      _glfwInputError(0x10003,(char *)0x0);
      iVar1 = _glfw.hints.redBits;
      iVar2 = _glfw.hints.greenBits;
      iVar3 = _glfw.hints.blueBits;
      iVar4 = _glfw.hints.alphaBits;
      iVar5 = _glfw.hints.depthBits;
      iVar6 = _glfw.hints.stencilBits;
      iVar7 = _glfw.hints.accumRedBits;
      iVar8 = _glfw.hints.accumGreenBits;
      iVar9 = _glfw.hints.accumBlueBits;
      iVar10 = _glfw.hints.accumAlphaBits;
      iVar11 = _glfw.hints.auxBuffers;
      GVar12 = _glfw.hints.stereo;
      GVar13 = _glfw.hints.resizable;
      GVar14 = _glfw.hints.visible;
      GVar15 = _glfw.hints.decorated;
      iVar16 = _glfw.hints.samples;
      GVar17 = _glfw.hints.sRGB;
      iVar18 = _glfw.hints.refreshRate;
      iVar19 = _glfw.hints.clientAPI;
      iVar20 = _glfw.hints.glMajor;
      iVar21 = _glfw.hints.glMinor;
      GVar22 = _glfw.hints.glForward;
      GVar23 = _glfw.hints.glDebug;
      iVar24 = _glfw.hints.glProfile;
      iVar25 = _glfw.hints.glRobustness;
    }
  }
  _glfw.hints.glRobustness = iVar25;
  _glfw.hints.glProfile = iVar24;
  _glfw.hints.glDebug = GVar23;
  _glfw.hints.glForward = GVar22;
  _glfw.hints.glMinor = iVar21;
  _glfw.hints.glMajor = iVar20;
  _glfw.hints.clientAPI = iVar19;
  _glfw.hints.refreshRate = iVar18;
  _glfw.hints.sRGB = GVar17;
  _glfw.hints.samples = iVar16;
  _glfw.hints.decorated = GVar15;
  _glfw.hints.visible = GVar14;
  _glfw.hints.resizable = GVar13;
  _glfw.hints.stereo = GVar12;
  _glfw.hints.auxBuffers = iVar11;
  _glfw.hints.accumAlphaBits = iVar10;
  _glfw.hints.accumBlueBits = iVar9;
  _glfw.hints.accumGreenBits = iVar8;
  _glfw.hints.accumRedBits = iVar7;
  _glfw.hints.stencilBits = iVar6;
  _glfw.hints.depthBits = iVar5;
  _glfw.hints.alphaBits = iVar4;
  _glfw.hints.blueBits = iVar3;
  _glfw.hints.greenBits = iVar2;
  _glfw.hints.redBits = iVar1;
  return;
}

Assistant:

GLFWAPI void glfwWindowHint(int target, int hint)
{
    _GLFW_REQUIRE_INIT();

    switch (target)
    {
        case GLFW_RED_BITS:
            _glfw.hints.redBits = hint;
            break;
        case GLFW_GREEN_BITS:
            _glfw.hints.greenBits = hint;
            break;
        case GLFW_BLUE_BITS:
            _glfw.hints.blueBits = hint;
            break;
        case GLFW_ALPHA_BITS:
            _glfw.hints.alphaBits = hint;
            break;
        case GLFW_DEPTH_BITS:
            _glfw.hints.depthBits = hint;
            break;
        case GLFW_STENCIL_BITS:
            _glfw.hints.stencilBits = hint;
            break;
        case GLFW_ACCUM_RED_BITS:
            _glfw.hints.accumRedBits = hint;
            break;
        case GLFW_ACCUM_GREEN_BITS:
            _glfw.hints.accumGreenBits = hint;
            break;
        case GLFW_ACCUM_BLUE_BITS:
            _glfw.hints.accumBlueBits = hint;
            break;
        case GLFW_ACCUM_ALPHA_BITS:
            _glfw.hints.accumAlphaBits = hint;
            break;
        case GLFW_AUX_BUFFERS:
            _glfw.hints.auxBuffers = hint;
            break;
        case GLFW_STEREO:
            _glfw.hints.stereo = hint;
            break;
        case GLFW_REFRESH_RATE:
            _glfw.hints.refreshRate = hint;
            break;
        case GLFW_RESIZABLE:
            _glfw.hints.resizable = hint;
            break;
        case GLFW_DECORATED:
            _glfw.hints.decorated = hint;
            break;
        case GLFW_VISIBLE:
            _glfw.hints.visible = hint;
            break;
        case GLFW_SAMPLES:
            _glfw.hints.samples = hint;
            break;
        case GLFW_SRGB_CAPABLE:
            _glfw.hints.sRGB = hint;
            break;
        case GLFW_CLIENT_API:
            _glfw.hints.clientAPI = hint;
            break;
        case GLFW_CONTEXT_VERSION_MAJOR:
            _glfw.hints.glMajor = hint;
            break;
        case GLFW_CONTEXT_VERSION_MINOR:
            _glfw.hints.glMinor = hint;
            break;
        case GLFW_CONTEXT_ROBUSTNESS:
            _glfw.hints.glRobustness = hint;
            break;
        case GLFW_OPENGL_FORWARD_COMPAT:
            _glfw.hints.glForward = hint;
            break;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            _glfw.hints.glDebug = hint;
            break;
        case GLFW_OPENGL_PROFILE:
            _glfw.hints.glProfile = hint;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, NULL);
            break;
    }
}